

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O0

aom_codec_err_t read_obu_header(aom_read_bit_buffer *rb,int is_annexb,ObuHeader *header)

{
  int iVar1;
  uint32_t uVar2;
  long lVar3;
  aom_read_bit_buffer *in_RDX;
  int in_ESI;
  long *in_RDI;
  ptrdiff_t bit_buffer_byte_length;
  int bits;
  undefined4 in_stack_ffffffffffffffe8;
  aom_codec_err_t local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RDX == (aom_read_bit_buffer *)0x0)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    lVar3 = in_RDI[1] - *in_RDI;
    if (lVar3 < 1) {
      local_4 = AOM_CODEC_CORRUPT_FRAME;
    }
    else {
      in_RDX->bit_buffer = (uint8_t *)0x1;
      iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      if (iVar1 == 0) {
        bits = (int)((ulong)lVar3 >> 0x20);
        iVar1 = aom_rb_read_literal(in_RDX,bits);
        *(char *)&in_RDX->bit_buffer_end = (char)iVar1;
        uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        in_RDX->bit_offset = uVar2;
        iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        *(int *)((long)&in_RDX->bit_buffer_end + 4) = iVar1;
        if ((*(int *)((long)&in_RDX->bit_buffer_end + 4) == 0) && (in_ESI == 0)) {
          local_4 = AOM_CODEC_UNSUP_BITSTREAM;
        }
        else {
          aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
          if (in_RDX->bit_offset == 0) {
            *(undefined4 *)&in_RDX->field_0x14 = 0;
            *(undefined4 *)&in_RDX->error_handler_data = 0;
          }
          else {
            if (lVar3 == 1) {
              return AOM_CODEC_CORRUPT_FRAME;
            }
            in_RDX->bit_buffer = in_RDX->bit_buffer + 1;
            iVar1 = aom_rb_read_literal(in_RDX,bits);
            *(int *)&in_RDX->field_0x14 = iVar1;
            iVar1 = aom_rb_read_literal(in_RDX,bits);
            *(int *)&in_RDX->error_handler_data = iVar1;
            aom_rb_read_literal(in_RDX,bits);
          }
          local_4 = AOM_CODEC_OK;
        }
      }
      else {
        local_4 = AOM_CODEC_CORRUPT_FRAME;
      }
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t read_obu_header(struct aom_read_bit_buffer *rb,
                                       int is_annexb, ObuHeader *header) {
  if (!rb || !header) return AOM_CODEC_INVALID_PARAM;

  const ptrdiff_t bit_buffer_byte_length = rb->bit_buffer_end - rb->bit_buffer;
  if (bit_buffer_byte_length < 1) return AOM_CODEC_CORRUPT_FRAME;

  header->size = 1;

  if (aom_rb_read_bit(rb) != 0) {
    // Forbidden bit. Must not be set.
    return AOM_CODEC_CORRUPT_FRAME;
  }

  header->type = (OBU_TYPE)aom_rb_read_literal(rb, 4);
  header->has_extension = aom_rb_read_bit(rb);
  header->has_size_field = aom_rb_read_bit(rb);

  if (!header->has_size_field && !is_annexb) {
    // section 5 obu streams must have obu_size field set.
    return AOM_CODEC_UNSUP_BITSTREAM;
  }

  // obu_reserved_1bit must be set to 0. The value is ignored by a decoder.
  aom_rb_read_bit(rb);

  if (header->has_extension) {
    if (bit_buffer_byte_length == 1) return AOM_CODEC_CORRUPT_FRAME;

    header->size += 1;
    header->temporal_layer_id = aom_rb_read_literal(rb, 3);
    header->spatial_layer_id = aom_rb_read_literal(rb, 2);
    // extension_header_reserved_3bits must be set to 0. The value is ignored by
    // a decoder.
    aom_rb_read_literal(rb, 3);
  } else {
    header->temporal_layer_id = 0;
    header->spatial_layer_id = 0;
  }

  return AOM_CODEC_OK;
}